

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O1

void __thiscall flow::IRHandler::setEntryBlock(IRHandler *this,BasicBlock *bb)

{
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *this_00;
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  undefined8 extraout_RAX;
  iterator __position;
  long *unaff_R15;
  
  if (bb->handler_ == (IRHandler *)0x0) {
    setEntryBlock();
  }
  else {
    this_00 = &this->blocks_;
    for (__position._M_node =
              (this->blocks_).
              super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
        (__position._M_node != (_List_node_base *)this_00 &&
        ((BasicBlock *)__position._M_node[1]._M_next != bb));
        __position._M_node = (__position._M_node)->_M_next) {
    }
    if (__position._M_node != (_List_node_base *)this_00) {
      p_Var2 = __position._M_node[1]._M_next;
      __position._M_node[1]._M_next = (_List_node_base *)0x0;
      std::__cxx11::
      list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
      ::_M_erase(this_00,__position);
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = p_Var2;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->blocks_).
                super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      return;
    }
  }
  setEntryBlock();
  if (unaff_R15 != (long *)0x0) {
    (**(code **)(*unaff_R15 + 8))();
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void IRHandler::setEntryBlock(BasicBlock* bb) {
  FLOW_ASSERT(bb->getHandler(), "BasicBlock must belong to this handler.");

  auto i = std::find_if(blocks_.begin(), blocks_.end(),
                        [&](const auto& obj) { return obj.get() == bb; });
  FLOW_ASSERT(i != blocks_.end(), "BasicBlock must belong to this handler.");
  std::unique_ptr<BasicBlock> t = std::move(*i);
  blocks_.erase(i);
  blocks_.push_front(std::move(t));
}